

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# migrate.cpp
# Opt level: O2

void __thiscall wallet::MetaPage::Unserialize<AutoFile>(MetaPage *this,AutoFile *s)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  uint8_t uVar39;
  PageType PVar40;
  uint32_t uVar41;
  BTreeFlags BVar42;
  uint uVar43;
  runtime_error *this_00;
  BTreeFlags BVar44;
  long in_FS_OFFSET;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  uVar41 = ser_readdata32<AutoFile>(s);
  this->lsn_file = uVar41;
  uVar41 = ser_readdata32<AutoFile>(s);
  this->lsn_offset = uVar41;
  uVar41 = ser_readdata32<AutoFile>(s);
  this->page_num = uVar41;
  uVar41 = ser_readdata32<AutoFile>(s);
  this->magic = uVar41;
  uVar41 = ser_readdata32<AutoFile>(s);
  this->version = uVar41;
  uVar41 = ser_readdata32<AutoFile>(s);
  this->pagesize = uVar41;
  uVar39 = ser_readdata8<AutoFile>(s);
  this->encrypt_algo = uVar39;
  this->other_endian = this->magic == 0x62310500;
  PVar40 = ser_readdata8<AutoFile>(s);
  this->type = PVar40;
  uVar39 = ser_readdata8<AutoFile>(s);
  this->metaflags = uVar39;
  uVar39 = ser_readdata8<AutoFile>(s);
  this->unused1 = uVar39;
  uVar41 = ser_readdata32<AutoFile>(s);
  this->free_list = uVar41;
  uVar41 = ser_readdata32<AutoFile>(s);
  this->last_page = uVar41;
  uVar41 = ser_readdata32<AutoFile>(s);
  this->partitions = uVar41;
  uVar41 = ser_readdata32<AutoFile>(s);
  this->key_count = uVar41;
  uVar41 = ser_readdata32<AutoFile>(s);
  this->record_count = uVar41;
  BVar42 = ser_readdata32<AutoFile>(s);
  BVar44 = BVar42 >> 0x18 | (BVar42 & 0xff0000) >> 8 | (BVar42 & 0xff00) << 8 | BVar42 << 0x18;
  if (this->other_endian == false) {
    BVar44 = BVar42;
  }
  this->flags = BVar44;
  Unserialize<AutoFile,_std::byte,_20UL>(s,&this->uid);
  uVar41 = ser_readdata32<AutoFile>(s);
  this->unused2 = uVar41;
  uVar41 = ser_readdata32<AutoFile>(s);
  this->minkey = uVar41;
  uVar41 = ser_readdata32<AutoFile>(s);
  this->re_len = uVar41;
  uVar41 = ser_readdata32<AutoFile>(s);
  this->re_pad = uVar41;
  uVar41 = ser_readdata32<AutoFile>(s);
  this->root = uVar41;
  Unserialize<AutoFile,_char,_368>(s,&this->unused3);
  uVar41 = ser_readdata32<AutoFile>(s);
  this->crypto_magic = uVar41;
  Unserialize<AutoFile,_char,_12>(s,&this->trash);
  Unserialize<AutoFile,_unsigned_char,_20>(s,&this->iv);
  Unserialize<AutoFile,_unsigned_char,_16>(s,&this->chksum);
  uVar43 = this->page_num;
  if (this->other_endian == true) {
    uVar1 = this->lsn_file;
    uVar2 = this->lsn_offset;
    this->lsn_file = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18
    ;
    this->lsn_offset =
         uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    uVar43 = uVar43 >> 0x18 | (uVar43 & 0xff0000) >> 8 | (uVar43 & 0xff00) << 8 | uVar43 << 0x18;
    this->page_num = uVar43;
    uVar1 = this->magic;
    this->magic = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    uVar1 = this->version;
    this->version = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    uVar1 = this->pagesize;
    this->pagesize = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18
    ;
    auVar45._0_4_ = this->free_list;
    auVar45._4_4_ = this->last_page;
    auVar45._8_4_ = this->partitions;
    auVar45._12_4_ = this->key_count;
    auVar47[1] = 0;
    auVar47[0] = (byte)auVar45._8_4_;
    auVar47[2] = (char)((uint)auVar45._8_4_ >> 8);
    auVar47[3] = 0;
    auVar47[4] = (char)((uint)auVar45._8_4_ >> 0x10);
    auVar47[5] = 0;
    auVar47[6] = (char)((uint)auVar45._8_4_ >> 0x18);
    auVar47[7] = 0;
    auVar47[8] = (char)auVar45._12_4_;
    auVar47[9] = 0;
    auVar47[10] = (char)((uint)auVar45._12_4_ >> 8);
    auVar47[0xb] = 0;
    auVar47[0xc] = (char)((uint)auVar45._12_4_ >> 0x10);
    auVar47[0xd] = 0;
    auVar47[0xe] = (char)((uint)auVar45._12_4_ >> 0x18);
    auVar47[0xf] = 0;
    auVar48 = pshuflw(auVar47,auVar47,0x1b);
    auVar48 = pshufhw(auVar48,auVar48,0x1b);
    auVar21[0xd] = 0;
    auVar21._0_13_ = auVar45._0_13_;
    auVar21[0xe] = (char)((uint)auVar45._4_4_ >> 0x18);
    auVar23[0xc] = (char)((uint)auVar45._4_4_ >> 0x10);
    auVar23._0_12_ = auVar45._0_12_;
    auVar23._13_2_ = auVar21._13_2_;
    auVar25[0xb] = 0;
    auVar25._0_11_ = auVar45._0_11_;
    auVar25._12_3_ = auVar23._12_3_;
    auVar27[10] = (char)((uint)auVar45._4_4_ >> 8);
    auVar27._0_10_ = auVar45._0_10_;
    auVar27._11_4_ = auVar25._11_4_;
    auVar29[9] = 0;
    auVar29._0_9_ = auVar45._0_9_;
    auVar29._10_5_ = auVar27._10_5_;
    auVar31[8] = (char)auVar45._4_4_;
    auVar31._0_8_ = auVar45._0_8_;
    auVar31._9_6_ = auVar29._9_6_;
    auVar33._7_8_ = 0;
    auVar33._0_7_ = auVar31._8_7_;
    auVar35._1_8_ = SUB158(auVar33 << 0x40,7);
    auVar35[0] = (char)((uint)auVar45._0_4_ >> 0x18);
    auVar35._9_6_ = 0;
    auVar36._1_10_ = SUB1510(auVar35 << 0x30,5);
    auVar36[0] = (char)((uint)auVar45._0_4_ >> 0x10);
    auVar36._11_4_ = 0;
    auVar50._3_12_ = SUB1512(auVar36 << 0x20,3);
    auVar50[2] = (char)((uint)auVar45._0_4_ >> 8);
    auVar50[0] = (byte)auVar45._0_4_;
    auVar50[1] = 0;
    auVar50[0xf] = 0;
    auVar45 = pshuflw(auVar50,auVar50,0x1b);
    auVar45 = pshufhw(auVar45,auVar45,0x1b);
    sVar4 = auVar45._0_2_;
    sVar5 = auVar45._2_2_;
    sVar6 = auVar45._4_2_;
    sVar7 = auVar45._6_2_;
    sVar8 = auVar45._8_2_;
    sVar9 = auVar45._10_2_;
    sVar10 = auVar45._12_2_;
    sVar11 = auVar45._14_2_;
    sVar12 = auVar48._0_2_;
    sVar13 = auVar48._2_2_;
    sVar14 = auVar48._4_2_;
    sVar15 = auVar48._6_2_;
    sVar16 = auVar48._8_2_;
    sVar17 = auVar48._10_2_;
    sVar18 = auVar48._12_2_;
    sVar19 = auVar48._14_2_;
    *(char *)&this->free_list = (0 < sVar4) * (sVar4 < 0x100) * auVar45[0] - (0xff < sVar4);
    *(char *)((long)&this->free_list + 1) =
         (0 < sVar5) * (sVar5 < 0x100) * auVar45[2] - (0xff < sVar5);
    *(char *)((long)&this->free_list + 2) =
         (0 < sVar6) * (sVar6 < 0x100) * auVar45[4] - (0xff < sVar6);
    *(char *)((long)&this->free_list + 3) =
         (0 < sVar7) * (sVar7 < 0x100) * auVar45[6] - (0xff < sVar7);
    *(char *)&this->last_page = (0 < sVar8) * (sVar8 < 0x100) * auVar45[8] - (0xff < sVar8);
    *(char *)((long)&this->last_page + 1) =
         (0 < sVar9) * (sVar9 < 0x100) * auVar45[10] - (0xff < sVar9);
    *(char *)((long)&this->last_page + 2) =
         (0 < sVar10) * (sVar10 < 0x100) * auVar45[0xc] - (0xff < sVar10);
    *(char *)((long)&this->last_page + 3) =
         (0 < sVar11) * (sVar11 < 0x100) * auVar45[0xe] - (0xff < sVar11);
    *(char *)&this->partitions = (0 < sVar12) * (sVar12 < 0x100) * auVar48[0] - (0xff < sVar12);
    *(char *)((long)&this->partitions + 1) =
         (0 < sVar13) * (sVar13 < 0x100) * auVar48[2] - (0xff < sVar13);
    *(char *)((long)&this->partitions + 2) =
         (0 < sVar14) * (sVar14 < 0x100) * auVar48[4] - (0xff < sVar14);
    *(char *)((long)&this->partitions + 3) =
         (0 < sVar15) * (sVar15 < 0x100) * auVar48[6] - (0xff < sVar15);
    *(char *)&this->key_count = (0 < sVar16) * (sVar16 < 0x100) * auVar48[8] - (0xff < sVar16);
    *(char *)((long)&this->key_count + 1) =
         (0 < sVar17) * (sVar17 < 0x100) * auVar48[10] - (0xff < sVar17);
    *(char *)((long)&this->key_count + 2) =
         (0 < sVar18) * (sVar18 < 0x100) * auVar48[0xc] - (0xff < sVar18);
    *(char *)((long)&this->key_count + 3) =
         (0 < sVar19) * (sVar19 < 0x100) * auVar48[0xe] - (0xff < sVar19);
    uVar1 = this->record_count;
    this->record_count =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    auVar48._0_4_ = this->unused2;
    auVar48._4_4_ = this->minkey;
    auVar48._8_4_ = this->re_len;
    auVar48._12_4_ = this->re_pad;
    auVar49[1] = 0;
    auVar49[0] = (byte)auVar48._8_4_;
    auVar49[2] = (char)((uint)auVar48._8_4_ >> 8);
    auVar49[3] = 0;
    auVar49[4] = (char)((uint)auVar48._8_4_ >> 0x10);
    auVar49[5] = 0;
    auVar49[6] = (char)((uint)auVar48._8_4_ >> 0x18);
    auVar49[7] = 0;
    auVar49[8] = (char)auVar48._12_4_;
    auVar49[9] = 0;
    auVar49[10] = (char)((uint)auVar48._12_4_ >> 8);
    auVar49[0xb] = 0;
    auVar49[0xc] = (char)((uint)auVar48._12_4_ >> 0x10);
    auVar49[0xd] = 0;
    auVar49[0xe] = (char)((uint)auVar48._12_4_ >> 0x18);
    auVar49[0xf] = 0;
    auVar45 = pshuflw(auVar49,auVar49,0x1b);
    auVar50 = pshufhw(auVar45,auVar45,0x1b);
    auVar20[0xd] = 0;
    auVar20._0_13_ = auVar48._0_13_;
    auVar20[0xe] = (char)((uint)auVar48._4_4_ >> 0x18);
    auVar22[0xc] = (char)((uint)auVar48._4_4_ >> 0x10);
    auVar22._0_12_ = auVar48._0_12_;
    auVar22._13_2_ = auVar20._13_2_;
    auVar24[0xb] = 0;
    auVar24._0_11_ = auVar48._0_11_;
    auVar24._12_3_ = auVar22._12_3_;
    auVar26[10] = (char)((uint)auVar48._4_4_ >> 8);
    auVar26._0_10_ = auVar48._0_10_;
    auVar26._11_4_ = auVar24._11_4_;
    auVar28[9] = 0;
    auVar28._0_9_ = auVar48._0_9_;
    auVar28._10_5_ = auVar26._10_5_;
    auVar30[8] = (char)auVar48._4_4_;
    auVar30._0_8_ = auVar48._0_8_;
    auVar30._9_6_ = auVar28._9_6_;
    auVar34._7_8_ = 0;
    auVar34._0_7_ = auVar30._8_7_;
    auVar37._1_8_ = SUB158(auVar34 << 0x40,7);
    auVar37[0] = (char)((uint)auVar48._0_4_ >> 0x18);
    auVar37._9_6_ = 0;
    auVar38._1_10_ = SUB1510(auVar37 << 0x30,5);
    auVar38[0] = (char)((uint)auVar48._0_4_ >> 0x10);
    auVar38._11_4_ = 0;
    auVar32[2] = (char)((uint)auVar48._0_4_ >> 8);
    auVar32._0_2_ = (ushort)auVar48._0_4_;
    auVar32._3_12_ = SUB1512(auVar38 << 0x20,3);
    auVar46._0_2_ = (ushort)auVar48._0_4_ & 0xff;
    auVar46._2_13_ = auVar32._2_13_;
    auVar46[0xf] = 0;
    auVar45 = pshuflw(auVar46,auVar46,0x1b);
    auVar45 = pshufhw(auVar45,auVar45,0x1b);
    sVar4 = auVar45._0_2_;
    sVar5 = auVar45._2_2_;
    sVar6 = auVar45._4_2_;
    sVar7 = auVar45._6_2_;
    sVar8 = auVar45._8_2_;
    sVar9 = auVar45._10_2_;
    sVar10 = auVar45._12_2_;
    sVar11 = auVar45._14_2_;
    sVar12 = auVar50._0_2_;
    sVar13 = auVar50._2_2_;
    sVar14 = auVar50._4_2_;
    sVar15 = auVar50._6_2_;
    sVar16 = auVar50._8_2_;
    sVar17 = auVar50._10_2_;
    sVar18 = auVar50._12_2_;
    sVar19 = auVar50._14_2_;
    *(char *)&this->unused2 = (0 < sVar4) * (sVar4 < 0x100) * auVar45[0] - (0xff < sVar4);
    *(char *)((long)&this->unused2 + 1) =
         (0 < sVar5) * (sVar5 < 0x100) * auVar45[2] - (0xff < sVar5);
    *(char *)((long)&this->unused2 + 2) =
         (0 < sVar6) * (sVar6 < 0x100) * auVar45[4] - (0xff < sVar6);
    *(char *)((long)&this->unused2 + 3) =
         (0 < sVar7) * (sVar7 < 0x100) * auVar45[6] - (0xff < sVar7);
    *(char *)&this->minkey = (0 < sVar8) * (sVar8 < 0x100) * auVar45[8] - (0xff < sVar8);
    *(char *)((long)&this->minkey + 1) =
         (0 < sVar9) * (sVar9 < 0x100) * auVar45[10] - (0xff < sVar9);
    *(char *)((long)&this->minkey + 2) =
         (0 < sVar10) * (sVar10 < 0x100) * auVar45[0xc] - (0xff < sVar10);
    *(char *)((long)&this->minkey + 3) =
         (0 < sVar11) * (sVar11 < 0x100) * auVar45[0xe] - (0xff < sVar11);
    *(char *)&this->re_len = (0 < sVar12) * (sVar12 < 0x100) * auVar50[0] - (0xff < sVar12);
    *(char *)((long)&this->re_len + 1) =
         (0 < sVar13) * (sVar13 < 0x100) * auVar50[2] - (0xff < sVar13);
    *(char *)((long)&this->re_len + 2) =
         (0 < sVar14) * (sVar14 < 0x100) * auVar50[4] - (0xff < sVar14);
    *(char *)((long)&this->re_len + 3) =
         (0 < sVar15) * (sVar15 < 0x100) * auVar50[6] - (0xff < sVar15);
    *(char *)&this->re_pad = (0 < sVar16) * (sVar16 < 0x100) * auVar50[8] - (0xff < sVar16);
    *(char *)((long)&this->re_pad + 1) =
         (0 < sVar17) * (sVar17 < 0x100) * auVar50[10] - (0xff < sVar17);
    *(char *)((long)&this->re_pad + 2) =
         (0 < sVar18) * (sVar18 < 0x100) * auVar50[0xc] - (0xff < sVar18);
    *(char *)((long)&this->re_pad + 3) =
         (0 < sVar19) * (sVar19 < 0x100) * auVar50[0xe] - (0xff < sVar19);
    uVar1 = this->root;
    this->root = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    uVar1 = this->crypto_magic;
    this->crypto_magic =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  }
  if (uVar43 == this->expected_page_num) {
    if (this->magic == 0x53162) {
      if (this->version == 9) {
        uVar43 = this->pagesize;
        if (uVar43 - 0x200 < 0xfe01) {
          uVar43 = uVar43 - (uVar43 >> 1 & 0x55555555);
          uVar43 = (uVar43 >> 2 & 0x33333333) + (uVar43 & 0x33333333);
          if (((uVar43 >> 4) + uVar43 & 0xf0f0f0f) * 0x1010101 >> 0x18 < 2) {
            if (this->type == BTREE_META) {
              if (this->flags == SUBDB) {
                if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
                  return;
                }
                goto LAB_004bab65;
              }
              this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error
                        (this_00,"Unexpected database flags, should only be 0x20 (subdatabases)");
            }
            else {
              this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error
                        (this_00,"Unexpected page type, should be 9 (BTree Metadata)");
            }
            goto LAB_004baafc;
          }
        }
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"Bad page size");
      }
      else {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"Unsupported BDB data file version number");
      }
    }
    else {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Not a BDB file");
    }
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Meta page number mismatch");
  }
LAB_004baafc:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
LAB_004bab65:
  __stack_chk_fail();
}

Assistant:

void Unserialize(Stream& s)
    {
        s >> lsn_file;
        s >> lsn_offset;
        s >> page_num;
        s >> magic;
        s >> version;
        s >> pagesize;
        s >> encrypt_algo;

        other_endian = magic == BTREE_MAGIC_OE;

        uint8_t uint8_type;
        s >> uint8_type;
        type = static_cast<PageType>(uint8_type);

        s >> metaflags;
        s >> unused1;
        s >> free_list;
        s >> last_page;
        s >> partitions;
        s >> key_count;
        s >> record_count;

        uint32_t uint32_flags;
        s >> uint32_flags;
        if (other_endian) {
            uint32_flags = internal_bswap_32(uint32_flags);
        }
        flags = static_cast<BTreeFlags>(uint32_flags);

        s >> uid;
        s >> unused2;
        s >> minkey;
        s >> re_len;
        s >> re_pad;
        s >> root;
        s >> unused3;
        s >> crypto_magic;
        s >> trash;
        s >> iv;
        s >> chksum;

        if (other_endian) {
            lsn_file = internal_bswap_32(lsn_file);
            lsn_offset = internal_bswap_32(lsn_offset);
            page_num = internal_bswap_32(page_num);
            magic = internal_bswap_32(magic);
            version = internal_bswap_32(version);
            pagesize = internal_bswap_32(pagesize);
            free_list = internal_bswap_32(free_list);
            last_page = internal_bswap_32(last_page);
            partitions = internal_bswap_32(partitions);
            key_count = internal_bswap_32(key_count);
            record_count = internal_bswap_32(record_count);
            unused2 = internal_bswap_32(unused2);
            minkey = internal_bswap_32(minkey);
            re_len = internal_bswap_32(re_len);
            re_pad = internal_bswap_32(re_pad);
            root = internal_bswap_32(root);
            crypto_magic = internal_bswap_32(crypto_magic);
        }

        // Page number must match
        if (page_num != expected_page_num) {
            throw std::runtime_error("Meta page number mismatch");
        }

        // Check magic
        if (magic != BTREE_MAGIC) {
            throw std::runtime_error("Not a BDB file");
        }

        // Only version 9 is supported
        if (version != 9) {
            throw std::runtime_error("Unsupported BDB data file version number");
        }

        // Page size must be 512 <= pagesize <= 64k, and be a power of 2
        if (pagesize < 512 || pagesize > 65536 || (pagesize & (pagesize - 1)) != 0) {
            throw std::runtime_error("Bad page size");
        }

        // Page type must be the btree type
        if (type != PageType::BTREE_META) {
            throw std::runtime_error("Unexpected page type, should be 9 (BTree Metadata)");
        }

        // Only supported meta-flag is subdatabase
        if (flags != BTreeFlags::SUBDB) {
            throw std::runtime_error("Unexpected database flags, should only be 0x20 (subdatabases)");
        }
    }